

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

Id __thiscall spv::Builder::makeRuntimeArray(Builder *this,Id element)

{
  Id IVar1;
  Id componentCount;
  Instruction *this_00;
  mapped_type_conflict *pmVar2;
  Id local_30;
  Id local_2c;
  Id debugResultId;
  pointer local_20;
  Instruction *type;
  Builder *pBStack_10;
  Id element_local;
  Builder *this_local;
  
  type._4_4_ = element;
  pBStack_10 = this;
  this_00 = (Instruction *)::operator_new(0x60);
  IVar1 = getUniqueId(this);
  spv::Instruction::Instruction(this_00,IVar1,0,OpTypeRuntimeArray);
  local_20 = this_00;
  spv::Instruction::addIdOperand(this_00,type._4_4_);
  std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
  unique_ptr<std::default_delete<spv::Instruction>,void>
            ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)
             &stack0xffffffffffffffd8,local_20);
  std::
  vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ::push_back(&this->constantsTypesGlobals,(value_type *)&stack0xffffffffffffffd8);
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
            ((unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
             &stack0xffffffffffffffd8);
  Module::mapInstruction(&this->module,local_20);
  IVar1 = type._4_4_;
  if ((this->emitNonSemanticShaderDebugInfo & 1U) != 0) {
    componentCount = makeUintConstant(this,0,false);
    IVar1 = makeArrayDebugType(this,IVar1,componentCount);
    local_2c = IVar1;
    local_30 = spv::Instruction::getResultId(local_20);
    pmVar2 = std::
             map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
             ::operator[](&this->debugId,&local_30);
    *pmVar2 = IVar1;
  }
  IVar1 = spv::Instruction::getResultId(local_20);
  return IVar1;
}

Assistant:

Id Builder::makeRuntimeArray(Id element)
{
    Instruction* type = new Instruction(getUniqueId(), NoType, OpTypeRuntimeArray);
    type->addIdOperand(element);
    constantsTypesGlobals.push_back(std::unique_ptr<Instruction>(type));
    module.mapInstruction(type);

    if (emitNonSemanticShaderDebugInfo)
    {
        auto const debugResultId = makeArrayDebugType(element, makeUintConstant(0));
        debugId[type->getResultId()] = debugResultId;
    }

    return type->getResultId();
}